

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall Assimp::X3DExporter::Export_Node(X3DExporter *this,aiNode *pNode,size_t pTabLevel)

{
  size_type *psVar1;
  size_t pTabLevel_00;
  uint uVar2;
  aiMetadataEntry *paVar3;
  aiVector3D pVector;
  aiVector3D pVector_00;
  size_t pTabLevel_01;
  bool bVar4;
  _Node *p_Var5;
  long *plVar6;
  undefined8 *puVar7;
  aiMetadata *paVar8;
  Logger *this_00;
  ulong *puVar9;
  size_type sVar10;
  long lVar11;
  char *pcVar12;
  aiString *pKey;
  undefined8 uVar13;
  long lVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 __x [4];
  float fVar20;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  ulong *local_328;
  long local_320;
  ulong local_318;
  long lStack_310;
  undefined8 local_308;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  long *local_2f0;
  undefined8 local_2e8;
  long local_2e0;
  undefined8 uStack_2d8;
  size_t local_2d0;
  aiVector3t<float> local_2c8;
  aiVector3t<float> local_2b8;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_2a8;
  float local_290;
  float local_28c;
  long *local_288;
  undefined8 local_280;
  long local_278;
  undefined8 uStack_270;
  ulong *local_268;
  long local_260;
  ulong local_258;
  long lStack_250;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [4];
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  string local_1a8 [2];
  ios_base local_158 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_2a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_2a8;
  local_2a8._M_impl._M_node._M_size = 0;
  local_2a8._M_impl._M_node.super__List_node_base._M_prev =
       local_2a8._M_impl._M_node.super__List_node_base._M_next;
  bVar4 = CheckAndExport_Light(this,pNode,pTabLevel);
  if (bVar4) goto LAB_0035776c;
  if ((pNode->mName).length != 0) {
    _local_1c8 = (pointer)&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"DEF","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,(pNode->mName).data,(allocator<char> *)&local_328);
    p_Var5 = std::__cxx11::
             list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
             ::_M_create_node<Assimp::X3DExporter::SAttribute>
                       ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_2a8,(SAttribute *)local_1c8);
    std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
    local_2a8._M_impl._M_node._M_size = local_2a8._M_impl._M_node._M_size + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &local_1b8) {
      operator_delete(_local_1c8,local_1b8._M_allocated_capacity + 1);
    }
  }
  local_2d0 = pTabLevel;
  if ((((((0.01 < ABS((pNode->mTransformation).a2)) || (0.01 < ABS((pNode->mTransformation).a3))) ||
        (0.01 < ABS((pNode->mTransformation).a4))) ||
       (((0.01 < ABS((pNode->mTransformation).b1) || (0.01 < ABS((pNode->mTransformation).b3))) ||
        ((0.01 < ABS((pNode->mTransformation).b4) ||
         ((0.01 < ABS((pNode->mTransformation).c1) || (0.01 < ABS((pNode->mTransformation).c2)))))))
       )) || ((0.01 < ABS((pNode->mTransformation).c4) ||
              ((((((0.01 < ABS((pNode->mTransformation).d1) ||
                   (0.01 < ABS((pNode->mTransformation).d2))) ||
                  (0.01 < ABS((pNode->mTransformation).d3))) ||
                 ((fVar19 = (pNode->mTransformation).a1, 1.01 < fVar19 || (fVar19 < 0.99)))) ||
                ((fVar19 = (pNode->mTransformation).b2, 1.01 < fVar19 ||
                 ((fVar19 < 0.99 || (fVar19 = (pNode->mTransformation).c3, 1.01 < fVar19)))))) ||
               (fVar19 < 0.99)))))) ||
     ((fVar19 = (pNode->mTransformation).d4, 1.01 < fVar19 || (fVar19 < 0.99)))) {
    local_2b8.x = 0.0;
    local_2b8.y = 0.0;
    local_2b8.z = 0.0;
    local_2c8.x = 0.0;
    local_2c8.y = 0.0;
    local_2c8.z = 0.0;
    local_1c8 = (undefined1  [4])0x3f800000;
    fStack_1c4 = 0.0;
    fStack_1c0 = 0.0;
    fStack_1bc = 0.0;
    aiMatrix4x4t<float>::Decompose
              (&pNode->mTransformation,&local_2b8,(aiQuaterniont<float> *)local_1c8,&local_2c8);
    fVar19 = SQRT((float)local_1c8 * (float)local_1c8 +
                  fStack_1bc * fStack_1bc + fStack_1c4 * fStack_1c4 + fStack_1c0 * fStack_1c0);
    if ((fVar19 != 0.0) || (__x = local_1c8, NAN(fVar19))) {
      fVar19 = 1.0 / fVar19;
      fStack_1bc = fStack_1bc * fVar19;
      __x = (undefined1  [4])((float)local_1c8 * fVar19);
      fStack_1c4 = fStack_1c4 * fVar19;
      fStack_1c0 = fStack_1c0 * fVar19;
    }
    uVar16 = 0;
    uStack_300 = 0;
    uStack_2fc = 0;
    fVar19 = 1.0 - (float)__x * (float)__x;
    if (fVar19 < 0.0) {
      fVar19 = sqrtf(fVar19);
      uVar16 = extraout_XMM0_Db;
      uStack_300 = extraout_XMM0_Dc;
      uStack_2fc = extraout_XMM0_Dd;
    }
    else {
      fVar19 = SQRT(fVar19);
    }
    local_308 = CONCAT44(uVar16,fVar19);
    fVar19 = acosf((float)__x);
    fVar19 = fVar19 + fVar19;
    if ((fVar19 != 0.0) || (NAN(fVar19))) {
      fVar17 = (float)(~-(uint)(ABS((float)local_308) < 0.01) & (uint)(float)local_308 |
                      -(uint)(ABS((float)local_308) < 0.01) & 0x3f800000);
      fVar20 = fStack_1c4 / fVar17;
      fVar18 = fStack_1c0 / fVar17;
      fVar17 = fStack_1bc / fVar17;
      local_308 = CONCAT44(local_308._4_4_,fVar18);
      if (0.0 < SQRT(fVar17 * fVar17 + fVar20 * fVar20 + fVar18 * fVar18)) {
        local_290 = fVar19;
        local_28c = fVar17;
        _local_1c8 = (pointer)&local_1b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"rotation","");
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_50,vsnprintf,0x3a,"%f",SUB84((double)fVar20,0));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_258 = *puVar9;
          lStack_250 = plVar6[3];
          local_268 = &local_258;
        }
        else {
          local_258 = *puVar9;
          local_268 = (ulong *)*plVar6;
        }
        local_260 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_1e8,vsnprintf,0x3a,"%f",SUB84((double)(float)local_308,0));
        uVar15 = 0xf;
        if (local_268 != &local_258) {
          uVar15 = local_258;
        }
        if (uVar15 < local_1e8._M_string_length + local_260) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            uVar13 = local_1e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_1e8._M_string_length + local_260) goto LAB_00356d45;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_268);
        }
        else {
LAB_00356d45:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_268,(ulong)local_1e8._M_dataplus._M_p);
        }
        local_288 = &local_278;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_278 = *plVar6;
          uStack_270 = puVar7[3];
        }
        else {
          local_278 = *plVar6;
          local_288 = (long *)*puVar7;
        }
        local_280 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_288);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_238 = *puVar9;
          lStack_230 = plVar6[3];
          local_248 = &local_238;
        }
        else {
          local_238 = *puVar9;
          local_248 = (ulong *)*plVar6;
        }
        local_240 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_208,vsnprintf,0x3a,"%f",SUB84((double)local_28c,0));
        uVar15 = 0xf;
        if (local_248 != &local_238) {
          uVar15 = local_238;
        }
        if (uVar15 < local_208._M_string_length + local_240) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            uVar13 = local_208.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_208._M_string_length + local_240) goto LAB_00356eaa;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_248);
        }
        else {
LAB_00356eaa:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_248,(ulong)local_208._M_dataplus._M_p);
        }
        local_2f0 = &local_2e0;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_2e0 = *plVar6;
          uStack_2d8 = puVar7[3];
        }
        else {
          local_2e0 = *plVar6;
          local_2f0 = (long *)*puVar7;
        }
        local_2e8 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_318 = *puVar9;
          lStack_310 = plVar6[3];
          local_328 = &local_318;
        }
        else {
          local_318 = *puVar9;
          local_328 = (ulong *)*plVar6;
        }
        local_320 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_228,vsnprintf,0x3a,"%f",SUB84((double)local_290,0));
        uVar15 = 0xf;
        if (local_328 != &local_318) {
          uVar15 = local_318;
        }
        if (uVar15 < local_228._M_string_length + local_320) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            uVar13 = local_228.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_228._M_string_length + local_320) goto LAB_00356feb;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_328);
        }
        else {
LAB_00356feb:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_328,(ulong)local_228._M_dataplus._M_p);
        }
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        psVar1 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_1a8[0].field_2._0_8_ = *psVar1;
          local_1a8[0].field_2._8_8_ = puVar7[3];
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar1;
          local_1a8[0]._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_1a8[0]._M_string_length = puVar7[1];
        *puVar7 = psVar1;
        puVar7[1] = 0;
        *(undefined1 *)psVar1 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (local_328 != &local_318) {
          operator_delete(local_328,local_318 + 1);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,local_238 + 1);
        }
        if (local_288 != &local_278) {
          operator_delete(local_288,local_278 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268,local_258 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_1a8[0]._M_string_length != 0) {
          sVar10 = 0;
          do {
            if (local_1a8[0]._M_dataplus._M_p[sVar10] == ',') {
              local_1a8[0]._M_dataplus._M_p[sVar10] = '.';
            }
            sVar10 = sVar10 + 1;
          } while (local_1a8[0]._M_string_length != sVar10);
        }
        p_Var5 = std::__cxx11::
                 list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                 ::_M_create_node<Assimp::X3DExporter::SAttribute>
                           ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                             *)&local_2a8,(SAttribute *)local_1c8);
        std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
        local_2a8._M_impl._M_node._M_size = local_2a8._M_impl._M_node._M_size + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_1c8 != &local_1b8) {
          operator_delete(_local_1c8,local_1b8._M_allocated_capacity + 1);
        }
      }
    }
    if (((1e-06 < ABS(local_2b8.x + -1.0)) || (1e-06 < ABS(local_2b8.y + -1.0))) ||
       (1e-06 < ABS(local_2b8.z + -1.0))) {
      pcVar12 = "scale";
      _local_1c8 = (pointer)&local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"scale","");
      pVector_00.y = local_2b8.y;
      pVector_00.x = local_2b8.x;
      pVector_00.z = local_2b8.z;
      Export_Node(aiNode_const*,unsigned_long)::$_1::operator()[abi_cxx11_
                (local_1a8,pcVar12,pVector_00);
      p_Var5 = std::__cxx11::
               list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               ::_M_create_node<Assimp::X3DExporter::SAttribute>
                         ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&local_2a8,(SAttribute *)local_1c8);
      std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
      local_2a8._M_impl._M_node._M_size = local_2a8._M_impl._M_node._M_size + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1c8 != &local_1b8) {
        operator_delete(_local_1c8,local_1b8._M_allocated_capacity + 1);
      }
    }
    if (0.0 < SQRT(local_2c8.z * local_2c8.z + local_2c8.x * local_2c8.x + local_2c8.y * local_2c8.y
                  )) {
      pcVar12 = "translation";
      _local_1c8 = (pointer)&local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"translation","");
      pVector.y = local_2c8.y;
      pVector.x = local_2c8.x;
      pVector.z = local_2c8.z;
      Export_Node(aiNode_const*,unsigned_long)::$_1::operator()[abi_cxx11_
                (local_1a8,pcVar12,pVector);
      p_Var5 = std::__cxx11::
               list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               ::_M_create_node<Assimp::X3DExporter::SAttribute>
                         ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&local_2a8,(SAttribute *)local_1c8);
      std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
      local_2a8._M_impl._M_node._M_size = local_2a8._M_impl._M_node._M_size + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1c8 != &local_1b8) {
        operator_delete(_local_1c8,local_1b8._M_allocated_capacity + 1);
      }
    }
    _local_1c8 = (pointer)&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Transform","");
    NodeHelper_OpenNode(this,(string *)local_1c8,pTabLevel,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &local_1b8) {
      operator_delete(_local_1c8,local_1b8._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  else {
    _local_1c8 = (pointer)&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Group","");
    NodeHelper_OpenNode(this,(string *)local_1c8,local_2d0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &local_1b8) {
      operator_delete(_local_1c8,local_1b8._M_allocated_capacity + 1);
    }
    bVar4 = true;
  }
  paVar8 = pNode->mMetaData;
  if ((paVar8 != (aiMetadata *)0x0) && (paVar8->mNumProperties != 0)) {
    local_308 = local_2d0 + 1;
    lVar14 = 8;
    lVar11 = 0;
    uVar15 = 0;
    do {
      paVar3 = paVar8->mValues;
      uVar2 = *(uint *)((long)paVar3 + lVar14 + -8);
      if (uVar2 < 6) {
        pKey = (aiString *)(paVar8->mKeys->data + lVar11 + -4);
        switch(uVar2) {
        case 0:
          Export_MetadataBoolean
                    (this,pKey,*(bool *)*(undefined8 *)((long)&paVar3->mType + lVar14),local_308);
          break;
        case 1:
          Export_MetadataInteger(this,pKey,**(int32_t **)((long)&paVar3->mType + lVar14),local_308);
          break;
        case 2:
          goto switchD_003574c0_caseD_2;
        case 3:
          Export_MetadataFloat(this,pKey,**(float **)((long)&paVar3->mType + lVar14),local_308);
          break;
        case 4:
          Export_MetadataDouble(this,pKey,**(double **)((long)&paVar3->mType + lVar14),local_308);
          break;
        case 5:
          Export_MetadataString(this,pKey,*(aiString **)((long)&paVar3->mType + lVar14),local_308);
        }
      }
      else {
switchD_003574c0_caseD_2:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<((ostringstream *)local_1c8,uVar2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x6ae914);
        local_328 = &local_318;
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_318 = *puVar9;
          lStack_310 = plVar6[3];
        }
        else {
          local_318 = *puVar9;
          local_328 = (ulong *)*plVar6;
        }
        local_320 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        this_00 = DefaultLogger::get();
        Logger::error(this_00,(char *)local_328);
        if (local_328 != &local_318) {
          operator_delete(local_328,local_318 + 1);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
      }
      uVar15 = uVar15 + 1;
      paVar8 = pNode->mMetaData;
      lVar11 = lVar11 + 0x404;
      lVar14 = lVar14 + 0x10;
    } while (uVar15 < paVar8->mNumProperties);
  }
  pTabLevel_01 = local_2d0;
  if (pNode->mNumMeshes != 0) {
    pTabLevel_00 = local_2d0 + 1;
    uVar15 = 0;
    do {
      Export_Mesh(this,(ulong)pNode->mMeshes[uVar15],pTabLevel_00);
      uVar15 = uVar15 + 1;
    } while (uVar15 < pNode->mNumMeshes);
  }
  if (pNode->mNumChildren != 0) {
    uVar15 = 0;
    do {
      Export_Node(this,pNode->mChildren[uVar15],pTabLevel_01 + 1);
      uVar15 = uVar15 + 1;
    } while (uVar15 < pNode->mNumChildren);
  }
  if (bVar4) {
    _local_1c8 = (pointer)&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Group","");
    NodeHelper_CloseNode(this,(string *)local_1c8,pTabLevel_01);
  }
  else {
    _local_1c8 = (pointer)&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Transform","");
    NodeHelper_CloseNode(this,(string *)local_1c8,pTabLevel_01);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_1c8 != &local_1b8) {
    operator_delete(_local_1c8,local_1b8._M_allocated_capacity + 1);
  }
LAB_0035776c:
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_2a8);
  return;
}

Assistant:

void X3DExporter::Export_Node(const aiNode *pNode, const size_t pTabLevel)
{
bool transform = false;
list<SAttribute> attr_list;

	// In Assimp lights is stored in next way: light source store in mScene->mLights and in node tree must present aiNode with name same as
	// light source has. Considering it we must compare every aiNode name with light sources names. Why not to look where ligths is present
	// and save them to fili? Because corresponding aiNode can be already written to file and we can only add information to file not to edit.
	if(CheckAndExport_Light(*pNode, pTabLevel)) return;

	// Check if need DEF.
	if(pNode->mName.length) attr_list.push_back({"DEF", pNode->mName.C_Str()});

	// Check if need <Transformation> node against <Group>.
	if(!pNode->mTransformation.IsIdentity())
	{
		auto Vector2String = [this](const aiVector3D pVector) -> string
		{
			string tstr = to_string(pVector.x) + " " + to_string(pVector.y) + " " + to_string(pVector.z);

			AttrHelper_CommaToPoint(tstr);

			return tstr;
		};

		auto Rotation2String = [this](const aiVector3D pAxis, const ai_real pAngle) -> string
		{
			string tstr = to_string(pAxis.x) + " " + to_string(pAxis.y) + " " + to_string(pAxis.z) + " " + to_string(pAngle);

			AttrHelper_CommaToPoint(tstr);

			return tstr;
		};

		aiVector3D scale, translate, rotate_axis;
		ai_real rotate_angle;

		transform = true;
		pNode->mTransformation.Decompose(scale, rotate_axis, rotate_angle, translate);
		// Check if values different from default
		if((rotate_angle != 0) && (rotate_axis.Length() > 0))
			attr_list.push_back({"rotation", Rotation2String(rotate_axis, rotate_angle)});

        if(!scale.Equal({1.0,1.0,1.0})) {
            attr_list.push_back({"scale", Vector2String(scale)});
        }
        if(translate.Length() > 0) {
            attr_list.push_back({"translation", Vector2String(translate)});
        }
	}

	// Begin node if need.
	if(transform)
		NodeHelper_OpenNode("Transform", pTabLevel, false, attr_list);
	else
		NodeHelper_OpenNode("Group", pTabLevel);

	// Export metadata
	if(pNode->mMetaData != nullptr)
	{
		for(size_t idx_prop = 0; idx_prop < pNode->mMetaData->mNumProperties; idx_prop++)
		{
			const aiString* key;
			const aiMetadataEntry* entry;

			if(pNode->mMetaData->Get(idx_prop, key, entry))
			{
				switch(entry->mType)
				{
					case AI_BOOL:
						Export_MetadataBoolean(*key, *static_cast<bool*>(entry->mData), pTabLevel + 1);
						break;
					case AI_DOUBLE:
						Export_MetadataDouble(*key, *static_cast<double*>(entry->mData), pTabLevel + 1);
						break;
					case AI_FLOAT:
						Export_MetadataFloat(*key, *static_cast<float*>(entry->mData), pTabLevel + 1);
						break;
					case AI_INT32:
						Export_MetadataInteger(*key, *static_cast<int32_t*>(entry->mData), pTabLevel + 1);
						break;
					case AI_AISTRING:
						Export_MetadataString(*key, *static_cast<aiString*>(entry->mData), pTabLevel + 1);
						break;
					default:
						LogError("Unsupported metadata type: " + to_string(entry->mType));
						break;
				}// switch(entry->mType)
			}
		}
	}// if(pNode->mMetaData != nullptr)

	// Export meshes.
	for(size_t idx_mesh = 0; idx_mesh < pNode->mNumMeshes; idx_mesh++) Export_Mesh(pNode->mMeshes[idx_mesh], pTabLevel + 1);
	// Export children.
	for(size_t idx_node = 0; idx_node < pNode->mNumChildren; idx_node++) Export_Node(pNode->mChildren[idx_node], pTabLevel + 1);

	// End node if need.
	if(transform)
		NodeHelper_CloseNode("Transform", pTabLevel);
	else
		NodeHelper_CloseNode("Group", pTabLevel);
}